

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O2

void hit_bars(obj **obj_p,int objx,int objy,int barsx,int barsy,boolean your_fault,
             boolean from_invent)

{
  ushort uVar1;
  obj *obj;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  
  obj = *obj_p;
  uVar1 = obj->otyp;
  if (your_fault == '\0') {
    iVar3 = breaks(obj,(xchar)objx,(xchar)objy);
  }
  else {
    iVar3 = hero_breaks(obj,(xchar)objx,(xchar)objy,from_invent);
  }
  if (iVar3 == 0) {
    if ((uVar1 & 0xfffd) == 0x214) {
      pcVar4 = "Whang!";
    }
    else if ((obj->oclass == '\f') ||
            ((*(ushort *)&objects[(short)uVar1].field_0x11 & 0x1e0) == 0xe0)) {
      pcVar4 = "Clink!";
    }
    else {
      pcVar4 = "Clonk!";
    }
    pline(pcVar4);
    return;
  }
  *obj_p = (obj *)0x0;
  if (uVar1 == 0x141) {
    if ((viz_array[barsy][barsx] & 2U) == 0) {
      pcVar4 = "a hissing noise.";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar4 = "angry snakes!";
        }
        else {
          bVar2 = dmgtype(youmonst.data,0x24);
          pcVar4 = "a hissing noise.";
          if (bVar2 == '\0') {
            pcVar4 = "angry snakes!";
          }
        }
      }
      You_hear(pcVar4);
    }
    else {
      pline("The iron bars are dissolved!");
    }
    dissolve_bars(barsx,barsy);
    if ((your_fault != '\0') && (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) {
      sokoban_trickster();
      return;
    }
  }
  return;
}

Assistant:

void hit_bars(struct obj **obj_p, int objx, int objy, int barsx, int barsy,
	      boolean your_fault, boolean from_invent)
{
	struct obj *otmp = *obj_p;
	int obj_type = otmp->otyp;

	if (your_fault ? hero_breaks(otmp, objx, objy, from_invent) :
			 breaks(otmp, objx, objy)) {
	    *obj_p = NULL;		/* object is now gone */
	    /* breakage makes its own noises */
	    if (obj_type == POT_ACID) {
		if (cansee(barsx, barsy)) {
		    pline("The iron bars are dissolved!");
		} else {
		    You_hear(Hallucination ? "angry snakes!" : "a hissing noise.");
		}
		dissolve_bars(barsx, barsy);
		if (your_fault && In_sokoban(&u.uz))
		    sokoban_trickster();
	    }
	} else if (obj_type == BOULDER || obj_type == HEAVY_IRON_BALL) {
	    pline("Whang!");
	} else if (otmp->oclass == COIN_CLASS ||
		   objects[obj_type].oc_material == GOLD ||
		   objects[obj_type].oc_material == SILVER) {
	    pline("Clink!");
	} else {
	    pline("Clonk!");
	}
}